

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O3

ZyanStatus ZydisStringAppendShort(ZyanString *destination,ZydisShortString *source)

{
  ZyanStatus ZVar1;
  ZyanUSize ZVar2;
  ulong uVar3;
  
  if ((destination == (ZyanString *)0x0) || (source == (ZydisShortString *)0x0)) {
    __assert_fail("destination && source",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                  ,0xea,"ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)")
    ;
  }
  if ((destination->vector).allocator != (ZyanAllocator *)0x0) {
    __assert_fail("!destination->vector.allocator",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                  ,0xeb,"ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)")
    ;
  }
  ZVar2 = (destination->vector).size;
  if ((ZVar2 != 0) && (uVar3 = (ulong)source->size, uVar3 != 0)) {
    ZVar1 = 0x80100009;
    if (ZVar2 + uVar3 <= (destination->vector).capacity) {
      memcpy((void *)((long)(destination->vector).data + (ZVar2 - 1)),source->data,uVar3 + 1);
      ZVar2 = (ulong)source->size + (destination->vector).size;
      (destination->vector).size = ZVar2;
      ZVar1 = 0x100000;
      if (*(char *)((long)(destination->vector).data + (ZVar2 - 1)) != '\0') {
        __assert_fail("*(char*)((ZyanU8*)(destination)->vector.data + (destination)->vector.size - 1) == \'\\0\'"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                      ,0xf7,
                      "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)");
      }
    }
    return ZVar1;
  }
  __assert_fail("destination->vector.size && source->size",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                ,0xec,"ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)");
}

Assistant:

ZYAN_INLINE ZyanStatus ZydisStringAppendShort(ZyanString* destination,
    const ZydisShortString* source)
{
    ZYAN_ASSERT(destination && source);
    ZYAN_ASSERT(!destination->vector.allocator);
    ZYAN_ASSERT(destination->vector.size && source->size);

    if (destination->vector.size + source->size > destination->vector.capacity)
    {
        return ZYAN_STATUS_INSUFFICIENT_BUFFER_SIZE;
    }

    ZYAN_MEMCPY((char*)destination->vector.data + destination->vector.size - 1, source->data,
        (ZyanUSize)source->size + 1);

    destination->vector.size += source->size;
    ZYDIS_STRING_ASSERT_NULLTERMINATION(destination);

    return ZYAN_STATUS_SUCCESS;
}